

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O3

int luaD_closeprotected(lua_State *L,ptrdiff_t level,int status)

{
  lu_byte lVar1;
  CallInfo *pCVar2;
  int iVar3;
  long local_40;
  int local_38;
  
  pCVar2 = L->ci;
  lVar1 = L->allowhook;
  local_40 = (long)(L->stack).p + level;
  local_38 = status;
  iVar3 = luaD_rawrunprotected(L,closepaux,&local_40);
  if (iVar3 != 0) {
    do {
      L->ci = pCVar2;
      L->allowhook = lVar1;
      local_40 = (long)(L->stack).p + level;
      local_38 = iVar3;
      iVar3 = luaD_rawrunprotected(L,closepaux,&local_40);
    } while (iVar3 != 0);
  }
  return local_38;
}

Assistant:

int luaD_closeprotected (lua_State *L, ptrdiff_t level, int status) {
  CallInfo *old_ci = L->ci;
  lu_byte old_allowhooks = L->allowhook;
  for (;;) {  /* keep closing upvalues until no more errors */
    struct CloseP pcl;
    pcl.level = restorestack(L, level); pcl.status = status;
    status = luaD_rawrunprotected(L, &closepaux, &pcl);
    if (l_likely(status == LUA_OK))  /* no more errors? */
      return pcl.status;
    else {  /* an error occurred; restore saved state and repeat */
      L->ci = old_ci;
      L->allowhook = old_allowhooks;
    }
  }
}